

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdLayerOverlay(int dst,int src)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int max;
  int max_00;
  
  uVar1 = ((uint)~src >> 0x18 & 0x7f) * ((uint)~dst >> 0x18 & 0x7f);
  iVar2 = gdAlphaOverlayColor((uint)src >> 0x10 & 0xff,(uint)dst >> 0x10 & 0xff,uVar1 % 0x7f);
  iVar3 = gdAlphaOverlayColor((uint)src >> 8 & 0xff,(uint)dst >> 8 & 0xff,max);
  iVar4 = gdAlphaOverlayColor(src & 0xff,dst & 0xff,max_00);
  return iVar4 + iVar3 * 0x100 + iVar2 * 0x10000 + (uVar1 / 0x7f) * -0x1000000 + 0x7f000000;
}

Assistant:

BGD_DECLARE(int) gdLayerOverlay (int dst, int src)
{
	int a1, a2;
	a1 = gdAlphaMax - gdTrueColorGetAlpha(dst);
	a2 = gdAlphaMax - gdTrueColorGetAlpha(src);
	return ( ((gdAlphaMax - a1*a2/gdAlphaMax) << 24) +
		(gdAlphaOverlayColor( gdTrueColorGetRed(src), gdTrueColorGetRed(dst), gdRedMax ) << 16) +
		(gdAlphaOverlayColor( gdTrueColorGetGreen(src), gdTrueColorGetGreen(dst), gdGreenMax ) << 8) +
		(gdAlphaOverlayColor( gdTrueColorGetBlue(src), gdTrueColorGetBlue(dst), gdBlueMax ))
		);
}